

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O3

void __thiscall OpenMD::FluctuatingChargeForces::initialize(FluctuatingChargeForces *this)

{
  pointer piVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  value_type_conflict2 local_1c;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->FQtypes)._M_t);
  piVar1 = (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_1c = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->FQtids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,&local_1c);
  for (p_Var3 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = AtomType::isFluctuatingCharge(*(AtomType **)(p_Var3 + 1));
    if (bVar2) {
      addType(this,*(AtomType **)(p_Var3 + 1));
    }
  }
  this->initialized_ = true;
  return;
}

Assistant:

void FluctuatingChargeForces::initialize() {
    FQtypes.clear();
    FQtids.clear();
    FQtids.resize(forceField_->getNAtomType(), -1);

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at)
      if ((*at)->isFluctuatingCharge()) addType(*at);

    initialized_ = true;
  }